

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::IsUSD(uint8_t *addr,size_t length,string *detected_format)

{
  bool bVar1;
  string *detected_format_local;
  size_t length_local;
  uint8_t *addr_local;
  
  bVar1 = IsUSDA(addr,length);
  if (bVar1) {
    if (detected_format != (string *)0x0) {
      ::std::__cxx11::string::operator=((string *)detected_format,"usda");
    }
    addr_local._7_1_ = true;
  }
  else {
    bVar1 = IsUSDC(addr,length);
    if (bVar1) {
      if (detected_format != (string *)0x0) {
        ::std::__cxx11::string::operator=((string *)detected_format,"usdc");
      }
      addr_local._7_1_ = true;
    }
    else {
      bVar1 = IsUSDZ(addr,length);
      if (bVar1) {
        if (detected_format != (string *)0x0) {
          ::std::__cxx11::string::operator=((string *)detected_format,"usdz");
        }
        addr_local._7_1_ = true;
      }
      else {
        addr_local._7_1_ = false;
      }
    }
  }
  return addr_local._7_1_;
}

Assistant:

bool IsUSD(const uint8_t *addr, const size_t length, std::string *detected_format) {
  if (IsUSDA(addr, length)) {
    if (detected_format) {
      (*detected_format) = "usda";
    }
    return true;
  }

  if (IsUSDC(addr, length)) {
    if (detected_format) {
      (*detected_format) = "usdc";
    }
    return true;
  }

  if (IsUSDZ(addr, length)) {
    if (detected_format) {
      (*detected_format) = "usdz";
    }
    return true;
  }

  return false;
}